

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_giant_strength(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  CHAR_DATA *in_RCX;
  CHAR_DATA *in_RDX;
  int in_EDI;
  AFFECT_DATA af;
  CHAR_DATA *victim;
  CHAR_DATA *in_stack_ffffffffffffff68;
  CHAR_DATA *in_stack_ffffffffffffff70;
  CHAR_DATA *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  
  bVar1 = is_affected(in_RCX,in_EDI);
  if (bVar1) {
    if (in_RCX == in_RDX) {
      send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    else {
      act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
          in_stack_ffffffffffffff68,0);
    }
  }
  else {
    init_affect((AFFECT_DATA *)0x6171b5);
    get_spell_aftype(in_stack_ffffffffffffff68);
    affect_to_char(in_stack_ffffffffffffff70,(AFFECT_DATA *)in_stack_ffffffffffffff68);
    send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
        in_stack_ffffffffffffff68,0);
  }
  return;
}

Assistant:

void spell_giant_strength(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;

	if (is_affected(victim, sn))
	{
		if (victim == ch)
			send_to_char("You are already as strong as you can get!\n\r", ch);
		else
			act("$N can't get any stronger.", ch, nullptr, victim, TO_CHAR);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = get_spell_aftype(ch);
	af.type = sn;
	af.level = level;
	af.duration = level;
	af.location = APPLY_STR;
	af.modifier = 1 + (level >= 18) + (level >= 25) + (level >= 32);
	affect_to_char(victim, &af);

	send_to_char("Your muscles surge with heightened power!\n\r", victim);
	act("$n's muscles surge with heightened power.", victim, nullptr, nullptr, TO_ROOM);
}